

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

void __thiscall XPMP2::UDPMulticast::SendToAll(UDPMulticast *this)

{
  pointer pcVar1;
  byte bVar2;
  uint32_t in_R8D;
  bool bVar3;
  string local_30;
  
  _NetwGetLocalAddresses(false);
  bVar3 = gAddrLocal._40_8_ != 0;
  this->bSendToAll = bVar3;
  if ((bVar3) && (this->oneIntfIdx = 0, glob < 2)) {
    pcVar1 = (this->multicastAddr)._M_dataplus._M_p;
    if (this->pMCAddr == (addrinfo *)0x0) {
      bVar2 = 0;
    }
    else {
      bVar2 = (byte)this->pMCAddr->ai_family;
    }
    NetwGetInterfaceNames_abi_cxx11_(&local_30,(XPMP2 *)(ulong)bVar2,'\0',0,in_R8D);
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Network.cpp"
           ,0x3ec,"SendToAll",logINFO,"MC %s: Sending on ALL interfaces: %s",pcVar1,
           local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void UDPMulticast::SendToAll ()
{
    _NetwGetLocalAddresses ();              // makes sure lists of multicast interfaces are filled, too
    if ((bSendToAll = !gAddrLocal.empty())) {
        oneIntfIdx = 0;
        LOG_MSG(logINFO, "MC %s: Sending on ALL interfaces: %s",
                multicastAddr.c_str(), NetwGetInterfaceNames(GetFamily(), IFF_MULTICAST).c_str());
    }
}